

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDateTest.cpp
# Opt level: O3

int PDFDateTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  tm *ptVar7;
  time_t tVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  string mytime;
  PDFDate currentDate;
  PDFDate dayDate;
  PDFDate yearDate;
  time_t time_local;
  PDFDate emptyDate;
  char strtime_buff [1024];
  char *local_550;
  char *local_548;
  char local_540;
  undefined7 uStack_53f;
  PDFDate local_52c;
  PDFDate local_508;
  PDFDate local_4d8;
  PDFDate local_4b0;
  PDFDate local_48c;
  time_t local_468;
  PDFDate local_45c;
  string local_438 [32];
  
  PDFDate::PDFDate(&local_45c);
  PDFDate::ToString_abi_cxx11_(local_438,&local_45c);
  iVar4 = std::__cxx11::string::compare((char *)local_438);
  paVar1 = &local_438[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"wrong string conversion for empty date - ",0x29);
    PDFDate::ToString_abi_cxx11_(local_438,&local_45c);
    _Var3._M_p = local_438[0]._M_dataplus._M_p;
    if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar6 = strlen(local_438[0]._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    iVar4 = -1;
  }
  PDFDate::PDFDate(&local_48c);
  local_48c.Year = 0x7c0;
  PDFDate::ToString_abi_cxx11_(local_438,&local_48c);
  iVar5 = std::__cxx11::string::compare((char *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"wrong string conversion for year date - ",0x28);
    PDFDate::ToString_abi_cxx11_(local_438,&local_48c);
    _Var3._M_p = local_438[0]._M_dataplus._M_p;
    if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar6 = strlen(local_438[0]._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    iVar4 = -1;
  }
  PDFDate::PDFDate(&local_4b0);
  local_4b0.Year = 0x7c0;
  local_4b0.Month = 4;
  local_4b0.Day = 3;
  PDFDate::ToString_abi_cxx11_(local_438,&local_4b0);
  iVar5 = std::__cxx11::string::compare((char *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"wrong string conversion for day date - ",0x27);
    PDFDate::ToString_abi_cxx11_(local_438,&local_4b0);
    _Var3._M_p = local_438[0]._M_dataplus._M_p;
    if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar6 = strlen(local_438[0]._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    iVar4 = -1;
  }
  PDFDate::PDFDate(&local_4d8);
  local_4d8.Year = 0x7c0;
  local_4d8.Month = 4;
  local_4d8.Day = 3;
  local_4d8.Hour = 0x12;
  local_4d8.Minute = 0x1e;
  local_4d8.Second = 0x2d;
  PDFDate::ToString_abi_cxx11_(local_438,&local_4d8);
  iVar5 = std::__cxx11::string::compare((char *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"wrong string conversion for local date - ",0x29);
    PDFDate::ToString_abi_cxx11_(local_438,&local_4d8);
    _Var3._M_p = local_438[0]._M_dataplus._M_p;
    if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar6 = strlen(local_438[0]._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    iVar4 = -1;
  }
  PDFDate::PDFDate(&local_508);
  local_508.Year = 0x7c0;
  local_508.Month = 4;
  local_508.Day = 3;
  local_508.Hour = 0x12;
  local_508.Minute = 0x1e;
  local_508.Second = 0x2d;
  local_508.UTC = eEarlier;
  local_508.HourFromUTC = 2;
  local_508.MinuteFromUTC = 0;
  PDFDate::ToString_abi_cxx11_(local_438,&local_508);
  iVar5 = std::__cxx11::string::compare((char *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"wrong string conversion for full date - ",0x28);
    PDFDate::ToString_abi_cxx11_(local_438,&local_508);
    _Var3._M_p = local_438[0]._M_dataplus._M_p;
    if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar6 = strlen(local_438[0]._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    iVar4 = -1;
  }
  PDFDate::PDFDate(&local_52c);
  PDFDate::SetToCurrentTime(&local_52c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current time as represented in PDFDate - ",0x29);
  PDFDate::ToString_abi_cxx11_(local_438,&local_52c);
  _Var3._M_p = local_438[0]._M_dataplus._M_p;
  if (local_438[0]._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
  }
  else {
    sVar6 = strlen(local_438[0]._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var3._M_p,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  local_468 = time((time_t *)0x0);
  ptVar7 = gmtime(&local_468);
  ptVar7->tm_isdst = -1;
  tVar8 = mktime(ptVar7);
  ptVar7 = localtime(&local_468);
  iVar5 = (int)local_468;
  local_548 = (char *)0x0;
  local_540 = '\0';
  local_550 = &local_540;
  strftime((char *)local_438,0x400,"D:%Y%m%d%H%M%S",ptVar7);
  pcVar2 = local_548;
  strlen((char *)local_438);
  std::__cxx11::string::_M_replace((ulong)&local_550,0,pcVar2,(ulong)local_438);
  iVar5 = iVar5 - (int)tVar8;
  std::__cxx11::string::append((char *)&local_550);
  sprintf((char *)local_438,"%02d\'%02d\'",(ulong)(uint)(iVar5 / 0xe10),(ulong)(uint)(iVar5 % 0xe10)
         );
  std::__cxx11::string::append((char *)&local_550);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current system time using time_t is    - ",0x29);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_550,(long)local_548);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               " --> timezone test skipped as it\'s utc, you should change your timezone and try again. \n"
               ,0x58);
  }
  else {
    iVar10 = local_52c.MinuteFromUTC * 0x3c + local_52c.HourFromUTC * 0xe10;
    iVar11 = -iVar10;
    if (local_52c.UTC != eEarlier) {
      iVar11 = iVar10;
    }
    if (iVar11 != iVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"timezone does not match!\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," -> time_t    calculated: ",0x1a);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," (secs from UTC)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> PDFHummus calculated: ",0x1a);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar11);
      iVar4 = -1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  (secs from UTC)\n",0x12);
    }
  }
  if (local_550 != &local_540) {
    operator_delete(local_550,CONCAT71(uStack_53f,local_540) + 1);
  }
  PDFDate::~PDFDate(&local_52c);
  PDFDate::~PDFDate(&local_508);
  PDFDate::~PDFDate(&local_4d8);
  PDFDate::~PDFDate(&local_4b0);
  PDFDate::~PDFDate(&local_48c);
  PDFDate::~PDFDate(&local_45c);
  return (int)(iVar4 != 0);
}

Assistant:

int PDFDateTest(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;

	// Empty Date
	PDFDate emptyDate;
	if(emptyDate.ToString() != "")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for empty date - "<<emptyDate.ToString().c_str()<<"\n";
	}

	// Year only Date
	PDFDate yearDate;
	yearDate.Year = 1984;
	if(yearDate.ToString() != "D:1984")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for year date - "<<yearDate.ToString().c_str()<<"\n";
	}

	// Day only Date
	PDFDate dayDate;
	dayDate.Year = 1984;
	dayDate.Month = 4;
	dayDate.Day = 3;
	if(dayDate.ToString() != "D:19840403")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for day date - "<<dayDate.ToString().c_str()<<"\n";
	}
	// local Time Date
	PDFDate localTimeDate;
	localTimeDate.Year = 1984;
	localTimeDate.Month = 4;
	localTimeDate.Day = 3;
	localTimeDate.Hour = 18;
	localTimeDate.Minute = 30;
	localTimeDate.Second = 45;
	if(localTimeDate.ToString() != "D:19840403183045")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for local date - "<<localTimeDate.ToString().c_str()<<"\n";
	}
	// Fully qualified Time date
	PDFDate fullDate;
	fullDate.Year = 1984;
	fullDate.Month = 4;
	fullDate.Day = 3;
	fullDate.Hour = 18;
	fullDate.Minute = 30;
	fullDate.Second = 45;
	fullDate.UTC = PDFDate::eEarlier;
	fullDate.HourFromUTC = 2;
	fullDate.MinuteFromUTC = 0;
	if(fullDate.ToString() != "D:19840403183045-02'00'")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for full date - "<<fullDate.ToString().c_str()<<"\n";
	}

	// Just display the current time as set by PDFDate
	PDFDate currentDate;
	currentDate.SetToCurrentTime();
	cout<<"Current time as represented in PDFDate - "<<currentDate.ToString().c_str()<<"\n";

	{
		// time structs
		time_t  time_local			= time(NULL);
		tm * my_utc_time			= gmtime(&time_local);
		my_utc_time->tm_isdst = -1; // automatic dst
		time_t time_utc				= mktime(my_utc_time);
		tm *my_local_time			= std::localtime(&time_local);
		int timezone_difference		= (long)(time_local - time_utc);
		
		// buffers/text
		const int strtime_buffsize = 1024;
		char strtime_buff[strtime_buffsize];
		string mytime;

		std::strftime(strtime_buff
			, strtime_buffsize
			, "D:%Y%m%d%H%M%S"
			, my_local_time);
		
		// PDF-style time representation. (It's just information)
		mytime = strtime_buff;
		mytime.append(timezone_difference >= 0 ? "+" : "-");
		sprintf(strtime_buff, "%02d'%02d'"
			, (int)(timezone_difference / 3600)
			, timezone_difference % 3600);
		mytime.append(strtime_buff);
		// padd "Current time as represented in PDFDate - "
		cout << "Current system time using time_t is    - " << mytime << "\n";

		// we can't test if it's UTC+0
		if (timezone_difference == 0){
			cout << " --> timezone test skipped as it's utc, you should change your timezone and try again. \n";
		}
		else{
			// calc timezone offset according to PDFHummus
			int PDFTimezone_diff = (currentDate.UTC == PDFDate::eEarlier ? -1 : 1)
				* ((currentDate.HourFromUTC * 3600) + currentDate.MinuteFromUTC * 60);
			
			// compare.
			if (PDFTimezone_diff != timezone_difference){
				status = PDFHummus::eFailure;
				cout << "timezone does not match!\n" <<
					" -> time_t    calculated: " << timezone_difference << " (secs from UTC)\n" <<
					" -> PDFHummus calculated: " << PDFTimezone_diff << "  (secs from UTC)\n";
			}

		}
	}



	return status == eSuccess ? 0:1;
}